

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_data_writer.cpp
# Opt level: O0

void __thiscall
duckdb::OptimisticDataWriter::OptimisticDataWriter
          (OptimisticDataWriter *this,DataTable *table,OptimisticDataWriter *parent)

{
  bool bVar1;
  PartialBlockManager *in_RSI;
  undefined8 *in_RDI;
  unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>
  *this_00;
  
  *in_RDI = in_RSI;
  this_00 = (unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>
             *)(in_RDI + 1);
  unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>::
  unique_ptr((unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>
              *)0xc5a98e);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>_>
                      *)0xc5a99c);
  if (bVar1) {
    unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>
    ::operator->(this_00);
    PartialBlockManager::ClearBlocks(in_RSI);
  }
  return;
}

Assistant:

OptimisticDataWriter::OptimisticDataWriter(DataTable &table, OptimisticDataWriter &parent) : table(table) {
	if (parent.partial_manager) {
		parent.partial_manager->ClearBlocks();
	}
}